

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joystick.hpp
# Opt level: O2

void __thiscall Apple::II::JoystickPair::Joystick::Joystick(Joystick *this)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator_type local_79;
  _Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_78;
  Input local_60;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  local_60.type = Horizontal;
  local_60.info = (Info)0x0;
  local_50 = 5;
  local_48 = 0;
  local_40 = 6;
  local_38 = 0;
  local_28 = 1;
  local_18 = 2;
  __l._M_len = 5;
  __l._M_array = &local_60;
  local_30 = local_40;
  local_20 = local_40;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            ((vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> *)&local_78,
             __l,&local_79);
  Inputs::ConcreteJoystick::ConcreteJoystick
            (&this->super_ConcreteJoystick,
             (vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> *)&local_78)
  ;
  std::_Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::
  ~_Vector_base(&local_78);
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__ConcreteJoystick_0057e578;
  this->buttons[0] = false;
  this->buttons[1] = false;
  this->buttons[2] = false;
  this->axes[0] = 0.5;
  this->axes[1] = 0.5;
  return;
}

Assistant:

Joystick() :
					ConcreteJoystick({
						Input(Input::Horizontal),
						Input(Input::Vertical),

						// The Apple II offers three buttons between two joysticks;
						// this emulator puts three buttons on each joystick and
						// combines them.
						Input(Input::Fire, 0),
						Input(Input::Fire, 1),
						Input(Input::Fire, 2),
					}) {}